

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::anon_unknown_1::AttachmentTextureCubeMapFaceCase::test
          (AttachmentTextureCubeMapFaceCase *this)

{
  CallLogWrapper *this_00;
  GLenum textarget;
  GLenum reference;
  long lVar1;
  GLuint textureID;
  GLuint framebufferID;
  GLuint local_30;
  GLuint local_2c;
  
  lVar1 = 0;
  local_2c = 0;
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  glu::CallLogWrapper::glGenFramebuffers(this_00,1,&local_2c);
  glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,local_2c);
  ApiCase::expectError(&this->super_ApiCase,0);
  local_30 = 0;
  glu::CallLogWrapper::glGenTextures(this_00,1,&local_30);
  glu::CallLogWrapper::glBindTexture(this_00,0x8513,local_30);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glTexStorage2D(this_00,0x8513,1,0x8051,0x80,0x80);
  ApiCase::expectError(&this->super_ApiCase,0);
  do {
    textarget = *(GLenum *)((long)&DAT_00b3b790 + lVar1);
    reference = 0;
    glu::CallLogWrapper::glFramebufferTexture2D(this_00,0x8d40,0x8ce0,textarget,local_30,0);
    checkAttachmentParam
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
               0x8ce0,0x8cd3,textarget,reference);
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x18);
  glu::CallLogWrapper::glFramebufferTexture2D(this_00,0x8d40,0x8ce0,0xde1,0,0);
  glu::CallLogWrapper::glDeleteTextures(this_00,1,&local_30);
  glu::CallLogWrapper::glDeleteFramebuffers(this_00,1,&local_2c);
  ApiCase::expectError(&this->super_ApiCase,0);
  return;
}

Assistant:

void test (void)
	{
		GLuint framebufferID = 0;
		glGenFramebuffers(1, &framebufferID);
		glBindFramebuffer(GL_FRAMEBUFFER, framebufferID);
		expectError(GL_NO_ERROR);

		{
			GLuint textureID = 0;
			glGenTextures(1, &textureID);
			glBindTexture(GL_TEXTURE_CUBE_MAP, textureID);
			expectError(GL_NO_ERROR);

			glTexStorage2D(GL_TEXTURE_CUBE_MAP, 1, GL_RGB8, 128, 128);
			expectError(GL_NO_ERROR);

			const GLenum faces[] =
			{
				GL_TEXTURE_CUBE_MAP_POSITIVE_X, GL_TEXTURE_CUBE_MAP_NEGATIVE_X,
				GL_TEXTURE_CUBE_MAP_POSITIVE_Y, GL_TEXTURE_CUBE_MAP_NEGATIVE_Y,
				GL_TEXTURE_CUBE_MAP_POSITIVE_Z, GL_TEXTURE_CUBE_MAP_NEGATIVE_Z
			};

			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(faces); ++ndx)
			{
				glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, faces[ndx], textureID, 0);
				checkColorAttachmentParam(m_testCtx, *this, GL_FRAMEBUFFER, GL_FRAMEBUFFER_ATTACHMENT_TEXTURE_CUBE_MAP_FACE, faces[ndx]);
			}

			glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, 0, 0);
			glDeleteTextures(1, &textureID);
		}

		glDeleteFramebuffers(1, &framebufferID);
		expectError(GL_NO_ERROR);
	}